

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseLengthDelimited
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  uint32_t size;
  char *pcVar1;
  char *local_30;
  
  local_30 = ptr;
  size = ReadSize(&local_30);
  if (local_30 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else if (this->unknown_ == (string *)0x0) {
    pcVar1 = EpsCopyInputStream::Skip(&ctx->super_EpsCopyInputStream,local_30,size);
  }
  else {
    WriteVarint((ulong)(num * 8 + 2),this->unknown_);
    WriteVarint((long)(int)size,this->unknown_);
    pcVar1 = EpsCopyInputStream::AppendString
                       (&ctx->super_EpsCopyInputStream,local_30,size,this->unknown_);
  }
  return pcVar1;
}

Assistant:

const char* ParseLengthDelimited(uint32_t num, const char* ptr,
                                   ParseContext* ctx) {
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_ == nullptr) return ctx->Skip(ptr, size);
    WriteVarint(num * 8 + 2, unknown_);
    WriteVarint(size, unknown_);
    return ctx->AppendString(ptr, size, unknown_);
  }